

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O2

void vkt::memory::(anonymous_namespace)::
     removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryMapping*>
               (vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                *vec,MemoryMapping **val)

{
  pointer *pppMVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  long lVar4;
  
  ppMVar2 = (vec->
            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppMVar3 = (vec->
            super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0;
  while( true ) {
    if ((long)ppMVar3 - (long)ppMVar2 >> 3 == lVar4) {
      return;
    }
    if (ppMVar2[lVar4] == *val) break;
    lVar4 = lVar4 + 1;
  }
  ppMVar2[lVar4] = ppMVar3[-1];
  pppMVar1 = &(vec->
              super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  *pppMVar1 = *pppMVar1 + -1;
  return;
}

Assistant:

void removeFirstEqual (vector<T>& vec, const T& val)
{
	for (size_t ndx = 0; ndx < vec.size(); ndx++)
	{
		if (vec[ndx] == val)
		{
			vec[ndx] = vec.back();
			vec.pop_back();
			return;
		}
	}
}